

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

int firstNamelessRecord(int m,int firstcode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  int i;
  uint uVar6;
  
  iVar3 = m;
  if (firstcode <= m) {
    piVar5 = &TERRITORY_BOUNDARIES[m].flags;
    uVar1 = *piVar5;
    uVar6 = uVar1 & 0x1f;
    lVar4 = (long)m + 1;
    do {
      uVar2 = *piVar5;
      iVar3 = m;
      if (((uVar2 & 0x40) == 0) ||
         ((byte)(((byte)uVar2 & 0x1f) + (char)((uVar2 & 0x1f) * 0x34 >> 8) * -5 +
                 (char)((uVar2 & 0x1f) / 5) * '\n' + '\x01') !=
          (byte)(((byte)uVar1 & 0x1f) + (char)(uVar6 * 0x34 >> 8) * -5 + (char)(uVar6 / 5) * '\n' +
                '\x01'))) break;
      m = m + -1;
      lVar4 = lVar4 + -1;
      piVar5 = piVar5 + -5;
      iVar3 = firstcode + -1;
    } while (firstcode < lVar4);
  }
  return iVar3 + 1;
}

Assistant:

static int firstNamelessRecord(const int m, const int firstcode) {
    int i = m;
    const int codexm = coDex(m);
    ASSERT((0 <= m) && (m <= MAPCODE_BOUNDARY_MAX));
    ASSERT((0 <= firstcode) && (firstcode <= MAPCODE_BOUNDARY_MAX));
    while (i >= firstcode && coDex(i) == codexm && IS_NAMELESS(i)) {
        i--;
    }
    return (i + 1);
}